

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

double __thiscall IF97::BaseRegion::dgammar_dPI(BaseRegion *this,double T,double p)

{
  double dVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  double x;
  double x_00;
  double dVar6;
  double dVar7;
  ulong local_40;
  size_t i;
  double summer;
  double _TAU;
  double _PI;
  double p_local;
  double T_local;
  BaseRegion *this_local;
  
  (*this->_vptr_BaseRegion[3])(p);
  (*this->_vptr_BaseRegion[4])(T);
  i = 0;
  local_40 = 0;
  while( true ) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->Jr);
    if (sVar3 <= local_40) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->nr,local_40);
    dVar1 = *pvVar4;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->Ir,local_40);
    iVar2 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->Ir,local_40);
    dVar6 = powi(x,*pvVar5 + -1);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->Jr,local_40);
    dVar7 = powi(x_00,*pvVar5);
    i = (size_t)(dVar1 * (double)iVar2 * dVar6 * dVar7 + (double)i);
    local_40 = local_40 + 1;
  }
  return (double)i;
}

Assistant:

double dgammar_dPI(double T, double p) const{
            const double _PI = PIrterm(p), _TAU = TAUrterm(T);
            double summer = 0;
            for (std::size_t i = 0; i < Jr.size(); ++i){
                summer += nr[i]*Ir[i]*powi(_PI, Ir[i]-1)*powi(_TAU, Jr[i]);
            }
            return summer;
        }